

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O3

bool ST_IsLatencyVisible(void)

{
  if ((((hud_althud.Value) && (!automapactive)) &&
      ((screen->super_DSimpleCanvas).super_DCanvas.Height == viewheight)) &&
     (((screenblocks.Value == 0xb && (0 < hud_showlag.Value)) &&
      ((hud_showlag.Value != 1 || (netgame)))))) {
    return (uint)hud_showlag.Value < 3;
  }
  return false;
}

Assistant:

static bool IsAltHUDTextVisible()
{
	return hud_althud
		&& !automapactive
		&& (SCREENHEIGHT == viewheight)
		&& (11 == screenblocks);
}